

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O3

void __thiscall Equality_modelHH_Test::TestBody(Equality_modelHH_Test *this)

{
  char cVar1;
  char *pcVar2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  ModelPtr clonedModel;
  ModelPtr model;
  ParserPtr parser;
  long *local_98;
  unsigned_long local_90;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  AssertionResult local_80;
  long local_70 [2];
  AssertHelper local_60 [8];
  shared_ptr *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  long local_48 [2];
  shared_ptr *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  undefined1 local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  libcellml::Parser::create(SUB81(local_28,0));
  local_58 = (shared_ptr *)local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"generator/hodgkin_huxley_squid_axon_model_1952/model.cellml","");
  fileContents((string *)&local_80);
  libcellml::Parser::parseModel((string *)&local_38);
  if ((shared_ptr *)local_80._0_8_ != (shared_ptr *)local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  if (local_58 != (shared_ptr *)local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  local_58 = (shared_ptr *)0x0;
  local_90 = libcellml::Logger::issueCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_80,"size_t(0)","parser->issueCount()",(unsigned_long *)&local_58,
             &local_90);
  if ((string)local_80.success_ == (string)0x0) {
    testing::Message::Message((Message *)&local_58);
    if (local_80.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_80.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x397,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (((local_58 != (shared_ptr *)0x0) && (cVar1 = testing::internal::IsTrue(true), cVar1 != '\0')
        ) && (local_58 != (shared_ptr *)0x0)) {
      (**(code **)(*(long *)local_58 + 8))();
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_80.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  libcellml::Model::clone();
  local_80._0_8_ = local_58;
  local_80.message_.ptr_ = local_50;
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_50->_M_string_length = (int)local_50->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_50->_M_string_length = (int)local_50->_M_string_length + 1;
    }
  }
  cVar1 = libcellml::Entity::equals(local_38);
  local_90 = CONCAT71(local_90._1_7_,cVar1);
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_80.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (cVar1 == '\0') goto LAB_001218bc;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.message_.ptr_);
    if ((local_90 & 1) == 0) {
LAB_001218bc:
      testing::Message::Message((Message *)&local_98);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_80,(char *)&local_90,"model->equals(clonedModel)","false");
      testing::internal::AssertHelper::AssertHelper
                (local_60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
                 ,0x39b,(char *)local_80._0_8_);
      testing::internal::AssertHelper::operator=(local_60,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(local_60);
      if ((shared_ptr *)local_80._0_8_ != (shared_ptr *)local_70) {
        operator_delete((void *)local_80._0_8_,local_70[0] + 1);
      }
      if (((local_98 != (long *)0x0) && (cVar1 = testing::internal::IsTrue(true), cVar1 != '\0')) &&
         (local_98 != (long *)0x0)) {
        (**(code **)(*local_98 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80._0_8_ = local_38;
  local_80.message_.ptr_ = local_30;
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&local_30->_M_string_length = (int)local_30->_M_string_length + 1;
      UNLOCK();
    }
    else {
      *(int *)&local_30->_M_string_length = (int)local_30->_M_string_length + 1;
    }
  }
  cVar1 = libcellml::Entity::equals(local_58);
  local_90 = CONCAT71(local_90._1_7_,cVar1);
  local_88.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_80.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    if (cVar1 != '\0') goto LAB_00121a71;
  }
  else {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_80.message_.ptr_);
    if ((local_90 & 1) != 0) goto LAB_00121a71;
  }
  testing::Message::Message((Message *)&local_98);
  testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
            (&local_80,(char *)&local_90,"clonedModel->equals(model)","false");
  testing::internal::AssertHelper::AssertHelper
            (local_60,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
             ,0x39c,(char *)local_80._0_8_);
  testing::internal::AssertHelper::operator=(local_60,(Message *)&local_98);
  testing::internal::AssertHelper::~AssertHelper(local_60);
  if ((shared_ptr *)local_80._0_8_ != (shared_ptr *)local_70) {
    operator_delete((void *)local_80._0_8_,local_70[0] + 1);
  }
  if (((local_98 != (long *)0x0) && (cVar1 = testing::internal::IsTrue(true), cVar1 != '\0')) &&
     (local_98 != (long *)0x0)) {
    (**(code **)(*local_98 + 8))();
  }
LAB_00121a71:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50);
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Equality, modelHH)
{
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto clonedModel = model->clone();

    EXPECT_TRUE(model->equals(clonedModel));
    EXPECT_TRUE(clonedModel->equals(model));
}